

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O3

int XPMPGetPlaneModelName(XPMPPlaneID inPlaneID,char *outTxtBuf,int outTxtBufSize)

{
  pointer pcVar1;
  long *plVar2;
  Aircraft *this;
  string *psVar3;
  string mdlName;
  long *local_48;
  int local_40;
  long local_38 [2];
  
  this = XPMP2::AcFindByID(0);
  if (this == (Aircraft *)0x0) {
    local_40 = -1;
  }
  else {
    psVar3 = XPMP2::Aircraft::GetModelName_abi_cxx11_(this);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + psVar3->_M_string_length);
    plVar2 = local_48;
    if (0 < outTxtBufSize && outTxtBuf != (char *)0x0) {
      strncpy(outTxtBuf,(char *)local_48,(ulong)(uint)outTxtBufSize);
      outTxtBuf[(ulong)(uint)outTxtBufSize - 1] = '\0';
    }
    if (plVar2 != local_38) {
      operator_delete(plVar2,local_38[0] + 1);
    }
  }
  return local_40;
}

Assistant:

int     XPMPGetPlaneModelName(XPMPPlaneID             inPlaneID,
                              char *                  outTxtBuf,
                              int                     outTxtBufSize)
{
    Aircraft* pAc = AcFindByID(inPlaneID);
    if (pAc) {
        std::string mdlName = pAc->GetModelName();
        if (outTxtBuf && outTxtBufSize > 0) {
            strncpy(outTxtBuf, mdlName.c_str(), (size_t)outTxtBufSize);
            outTxtBuf[outTxtBufSize-1] = 0;         // safety measure: ensure zero-termination
        }
        return (int)mdlName.length();
    } else {
        return -1;
    }
}